

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NutDecompiler.cpp
# Opt level: O2

int __thiscall VMState::PopJNZInstructionWithTarget(VMState *this,int address)

{
  int iVar1;
  pointer piVar2;
  const_iterator __position;
  ulong uVar3;
  ulong uVar4;
  int pos;
  
  piVar2 = (this->m_JNZInstructions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (long)(this->m_JNZInstructions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar2;
  uVar4 = uVar3 >> 2;
  __position._M_current = (int *)((uVar3 & 0x3fffffffc) + (long)piVar2);
  do {
    if ((int)uVar4 < 1) {
      return -1;
    }
    iVar1 = __position._M_current[-1];
    __position._M_current = __position._M_current + -1;
    uVar4 = (ulong)((int)uVar4 - 1);
  } while ((this->m_Parent->m_Instructions).
           super__Vector_base<NutFunction::Instruction,_std::allocator<NutFunction::Instruction>_>.
           _M_impl.super__Vector_impl_data._M_start[iVar1].field_0.arg1 + iVar1 + 1 != address);
  std::vector<int,_std::allocator<int>_>::erase(&this->m_JNZInstructions,__position);
  return iVar1;
}

Assistant:

int PopJNZInstructionWithTarget( int address )
	{
		// Find last JNZ instruction that points at specified address (we need last to find
		// outermost do..while block)

		for( int i = (int)m_JNZInstructions.size() - 1; i >= 0; --i)
			if ((m_JNZInstructions[i] + 1 + m_Parent.m_Instructions[m_JNZInstructions[i]].arg1) == address)
			{
				int pos = m_JNZInstructions[i];
				m_JNZInstructions.erase(m_JNZInstructions.begin() + i);
				return pos;
			}

		return -1;
	}